

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlq.cpp
# Opt level: O3

void __thiscall
pg::TLQSolver::attractTangles(TLQSolver *this,int pl,int v,bitset *R,bitset *Z,bitset *G)

{
  int *piVar1;
  int *piVar2;
  
  piVar1 = this->tin[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar2 = this->tin[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    attractTangle(this,*piVar2,pl,R,Z,G);
  }
  return;
}

Assistant:

void
TLQSolver::attractTangles(int pl, int v, bitset &R, bitset &Z, bitset &G)
{
    const auto &in_cur = tin[v];
    for (int from : in_cur) attractTangle(from, pl, R, Z, G);
}